

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_filesystem.cpp
# Opt level: O3

void __thiscall Omega_h::filesystem::IteratorImpl::increment(IteratorImpl *this)

{
  int *piVar1;
  dirent *pdVar2;
  filesystem_error *this_00;
  undefined8 in_RSI;
  
  piVar1 = __errno_location();
  *piVar1 = 0;
  while( true ) {
    pdVar2 = readdir((DIR *)this->stream);
    this->entry = (dirent *)pdVar2;
    if (pdVar2 == (dirent *)0x0) {
      if (*piVar1 == 0) {
        close(this,(int)in_RSI);
        return;
      }
      this_00 = (filesystem_error *)__cxa_allocate_exception(0x20);
      filesystem_error::filesystem_error(this_00,*piVar1,"directory_iterator");
      __cxa_throw(this_00,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
    }
    if ((pdVar2->d_name[0] != '.') ||
       ((pdVar2->d_name[1] != '\0' && ((pdVar2->d_name[1] != '.' || (pdVar2->d_name[2] != '\0'))))))
    break;
    *piVar1 = 0;
  }
  return;
}

Assistant:

void increment() {
    errno = 0;
    entry = ::readdir(stream);
    if (entry == nullptr) {
      if (errno != 0) {
        throw filesystem_error(errno, "directory_iterator");
      }
      // safely reached the end of the directory
      close();
    } else {
      // we just extracted a good entry from the stream
      // skip dot and dot-dot, max 3-call recursion
      if (0 == strcmp(entry->d_name, "."))
        increment();
      else if (0 == strcmp(entry->d_name, ".."))
        increment();
    }
  }